

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.c
# Opt level: O0

int packet_queue_listener
              (LIBSSH2_SESSION *session,uchar *data,unsigned_long datalen,
              packet_queue_listener_state_t *listen_state)

{
  unsigned_long uVar1;
  uint uVar2;
  int iVar3;
  uint32_t uVar4;
  uchar *buf;
  size_t sVar5;
  void *pvVar6;
  undefined8 uVar7;
  LIBSSH2_CHANNEL *channel;
  uchar *s;
  int rc;
  char failure_code;
  LIBSSH2_LISTENER *listn;
  uchar *p;
  unsigned_long packet_len;
  packet_queue_listener_state_t *listen_state_local;
  unsigned_long datalen_local;
  uchar *data_local;
  LIBSSH2_SESSION *session_local;
  
  p = (uchar *)0x26;
  packet_len = (unsigned_long)listen_state;
  listen_state_local = (packet_queue_listener_state_t *)datalen;
  datalen_local = (unsigned_long)data;
  data_local = (uchar *)session;
  _rc = (list_node *)_libssh2_list_first(&session->listeners);
  uVar1 = datalen_local;
  s._7_1_ = '\x01';
  if (*(int *)packet_len == 0) {
    uVar2 = _libssh2_ntohu32((uchar *)(datalen_local + 0x14));
    *(uint *)(packet_len + 0x40) = uVar2;
    uVar2 = _libssh2_ntohu32((uchar *)(uVar1 + 0x18));
    *(uint *)(packet_len + 0x44) = uVar2;
    uVar2 = _libssh2_ntohu32((uchar *)(uVar1 + 0x1c));
    *(uint *)(packet_len + 0x48) = uVar2;
    uVar2 = _libssh2_ntohu32((uchar *)(uVar1 + 0x20));
    *(uint *)(packet_len + 0x54) = uVar2;
    *(unsigned_long *)(packet_len + 0x30) = uVar1 + 0x24;
    buf = (uchar *)(uVar1 + 0x24 + (ulong)*(uint *)(packet_len + 0x54));
    uVar2 = _libssh2_ntohu32(buf);
    *(uint *)(packet_len + 0x4c) = uVar2;
    uVar2 = _libssh2_ntohu32(buf + 4);
    *(uint *)(packet_len + 0x58) = uVar2;
    *(uchar **)(packet_len + 0x38) = buf + 8;
    uVar2 = _libssh2_ntohu32(buf + 8 + *(uint *)(packet_len + 0x58));
    *(uint *)(packet_len + 0x50) = uVar2;
    *(undefined4 *)packet_len = 1;
  }
  if (*(int *)packet_len != 3) {
    for (; _rc != (list_node *)0x0; _rc = (list_node *)_libssh2_list_next(_rc)) {
      if (((*(int *)&_rc[1].head == *(int *)(packet_len + 0x4c)) &&
          (sVar5 = strlen((char *)_rc[1].prev), sVar5 == *(uint *)(packet_len + 0x54))) &&
         (iVar3 = memcmp(_rc[1].prev,*(void **)(packet_len + 0x30),
                         (ulong)*(uint *)(packet_len + 0x54)), iVar3 == 0)) {
        *(undefined8 *)(packet_len + 0x60) = 0;
        if (*(int *)packet_len == 1) {
          if ((*(int *)((long)&_rc[2].head + 4) != 0) &&
             (*(int *)((long)&_rc[2].head + 4) <= *(int *)&_rc[2].head)) {
            s._7_1_ = '\x04';
            *(undefined4 *)packet_len = 3;
            break;
          }
          pvVar6 = _libssh2_calloc((LIBSSH2_SESSION *)data_local,0x2b0);
          if (pvVar6 == (void *)0x0) {
            _libssh2_error((LIBSSH2_SESSION *)data_local,-6,
                           "Unable to allocate a channel for new connection");
            s._7_1_ = '\x04';
            *(undefined4 *)packet_len = 3;
            break;
          }
          *(void **)(packet_len + 0x60) = pvVar6;
          *(uchar **)((long)pvVar6 + 0x60) = data_local;
          *(undefined4 *)((long)pvVar6 + 0x20) = 0xf;
          uVar7 = (**(code **)(data_local + 8))(*(int *)((long)pvVar6 + 0x20) + 1,data_local);
          *(undefined8 *)((long)pvVar6 + 0x18) = uVar7;
          if (*(long *)((long)pvVar6 + 0x18) == 0) {
            _libssh2_error((LIBSSH2_SESSION *)data_local,-6,
                           "Unable to allocate a channel for new connection");
            (**(code **)(data_local + 0x18))(pvVar6,data_local);
            s._7_1_ = '\x04';
            *(undefined4 *)packet_len = 3;
            break;
          }
          memcpy(*(void **)((long)pvVar6 + 0x18),"forwarded-tcpip",
                 (ulong)(*(int *)((long)pvVar6 + 0x20) + 1));
          *(undefined4 *)((long)pvVar6 + 0x44) = *(undefined4 *)(packet_len + 0x40);
          *(undefined4 *)((long)pvVar6 + 0x48) = 0x200000;
          *(undefined4 *)((long)pvVar6 + 0x4c) = 0x200000;
          *(undefined4 *)((long)pvVar6 + 0x50) = 0x8000;
          uVar4 = _libssh2_channel_nextid((LIBSSH2_SESSION *)data_local);
          *(uint32_t *)((long)pvVar6 + 0x30) = uVar4;
          *(undefined4 *)((long)pvVar6 + 0x34) = *(undefined4 *)(packet_len + 0x44);
          *(undefined4 *)((long)pvVar6 + 0x38) = *(undefined4 *)(packet_len + 0x44);
          *(undefined4 *)((long)pvVar6 + 0x3c) = *(undefined4 *)(packet_len + 0x48);
          listn = (LIBSSH2_LISTENER *)(packet_len + 5);
          *(undefined1 *)(packet_len + 4) = 0x5b;
          _libssh2_store_u32((uchar **)&listn,*(uint32_t *)((long)pvVar6 + 0x44));
          _libssh2_store_u32((uchar **)&listn,*(uint32_t *)((long)pvVar6 + 0x30));
          _libssh2_store_u32((uchar **)&listn,*(uint32_t *)((long)pvVar6 + 0x48));
          _libssh2_store_u32((uchar **)&listn,*(uint32_t *)((long)pvVar6 + 0x50));
          *(undefined4 *)packet_len = 2;
        }
        if (*(int *)packet_len == 2) {
          iVar3 = _libssh2_transport_send
                            ((LIBSSH2_SESSION *)data_local,(uchar *)(packet_len + 4),0x11,
                             (uchar *)0x0,0);
          if (iVar3 == -0x25) {
            return -0x25;
          }
          if (iVar3 != 0) {
            *(undefined4 *)packet_len = 0;
            iVar3 = _libssh2_error((LIBSSH2_SESSION *)data_local,iVar3,
                                   "Unable to send channel open confirmation");
            return iVar3;
          }
          if (*(long *)(packet_len + 0x60) != 0) {
            _libssh2_list_add((list_head *)(_rc + 2),*(list_node **)(packet_len + 0x60));
            *(int *)&_rc[2].head = *(int *)&_rc[2].head + 1;
          }
          *(undefined4 *)packet_len = 0;
          return 0;
        }
      }
    }
    *(undefined4 *)packet_len = 3;
  }
  listn = (LIBSSH2_LISTENER *)(packet_len + 5);
  *(undefined1 *)(packet_len + 4) = 0x5c;
  _libssh2_store_u32((uchar **)&listn,*(uint32_t *)(packet_len + 0x40));
  _libssh2_store_u32((uchar **)&listn,(int)s._7_1_);
  _libssh2_store_str((uchar **)&listn,"Forward not requested",0x15);
  _libssh2_htonu32((uchar *)listn,0);
  iVar3 = _libssh2_transport_send
                    ((LIBSSH2_SESSION *)data_local,(uchar *)(packet_len + 4),(size_t)p,(uchar *)0x0,
                     0);
  if (iVar3 == -0x25) {
    session_local._4_4_ = -0x25;
  }
  else if (iVar3 == 0) {
    *(undefined4 *)packet_len = 0;
    session_local._4_4_ = 0;
  }
  else {
    *(undefined4 *)packet_len = 0;
    session_local._4_4_ =
         _libssh2_error((LIBSSH2_SESSION *)data_local,iVar3,"Unable to send open failure");
  }
  return session_local._4_4_;
}

Assistant:

static inline int
packet_queue_listener(LIBSSH2_SESSION * session, unsigned char *data,
                      unsigned long datalen,
                      packet_queue_listener_state_t *listen_state)
{
    /*
     * Look for a matching listener
     */
    /* 17 = packet_type(1) + channel(4) + reason(4) + descr(4) + lang(4) */
    unsigned long packet_len = 17 + (sizeof(FwdNotReq) - 1);
    unsigned char *p;
    LIBSSH2_LISTENER *listn = _libssh2_list_first(&session->listeners);
    char failure_code = SSH_OPEN_ADMINISTRATIVELY_PROHIBITED;
    int rc;

    (void) datalen;

    if (listen_state->state == libssh2_NB_state_idle) {
        unsigned char *s = data + (sizeof("forwarded-tcpip") - 1) + 5;
        listen_state->sender_channel = _libssh2_ntohu32(s);
        s += 4;

        listen_state->initial_window_size = _libssh2_ntohu32(s);
        s += 4;
        listen_state->packet_size = _libssh2_ntohu32(s);
        s += 4;

        listen_state->host_len = _libssh2_ntohu32(s);
        s += 4;
        listen_state->host = s;
        s += listen_state->host_len;
        listen_state->port = _libssh2_ntohu32(s);
        s += 4;

        listen_state->shost_len = _libssh2_ntohu32(s);
        s += 4;
        listen_state->shost = s;
        s += listen_state->shost_len;
        listen_state->sport = _libssh2_ntohu32(s);

        _libssh2_debug(session, LIBSSH2_TRACE_CONN,
                       "Remote received connection from %s:%ld to %s:%ld",
                       listen_state->shost, listen_state->sport,
                       listen_state->host, listen_state->port);

        listen_state->state = libssh2_NB_state_allocated;
    }

    if (listen_state->state != libssh2_NB_state_sent) {
        while (listn) {
            if ((listn->port == (int) listen_state->port) &&
                (strlen(listn->host) == listen_state->host_len) &&
                (memcmp (listn->host, listen_state->host,
                         listen_state->host_len) == 0)) {
                /* This is our listener */
                LIBSSH2_CHANNEL *channel = NULL;
                listen_state->channel = NULL;

                if (listen_state->state == libssh2_NB_state_allocated) {
                    if (listn->queue_maxsize &&
                        (listn->queue_maxsize <= listn->queue_size)) {
                        /* Queue is full */
                        failure_code = SSH_OPEN_RESOURCE_SHORTAGE;
                        _libssh2_debug(session, LIBSSH2_TRACE_CONN,
                                       "Listener queue full, ignoring");
                        listen_state->state = libssh2_NB_state_sent;
                        break;
                    }

                    channel = LIBSSH2_CALLOC(session, sizeof(LIBSSH2_CHANNEL));
                    if (!channel) {
                        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                       "Unable to allocate a channel for "
                                       "new connection");
                        failure_code = SSH_OPEN_RESOURCE_SHORTAGE;
                        listen_state->state = libssh2_NB_state_sent;
                        break;
                    }
                    listen_state->channel = channel;

                    channel->session = session;
                    channel->channel_type_len = sizeof("forwarded-tcpip") - 1;
                    channel->channel_type = LIBSSH2_ALLOC(session,
                                                          channel->
                                                          channel_type_len +
                                                          1);
                    if (!channel->channel_type) {
                        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                       "Unable to allocate a channel for new"
                                       " connection");
                        LIBSSH2_FREE(session, channel);
                        failure_code = SSH_OPEN_RESOURCE_SHORTAGE;
                        listen_state->state = libssh2_NB_state_sent;
                        break;
                    }
                    memcpy(channel->channel_type, "forwarded-tcpip",
                           channel->channel_type_len + 1);

                    channel->remote.id = listen_state->sender_channel;
                    channel->remote.window_size_initial =
                        LIBSSH2_CHANNEL_WINDOW_DEFAULT;
                    channel->remote.window_size =
                        LIBSSH2_CHANNEL_WINDOW_DEFAULT;
                    channel->remote.packet_size =
                        LIBSSH2_CHANNEL_PACKET_DEFAULT;

                    channel->local.id = _libssh2_channel_nextid(session);
                    channel->local.window_size_initial =
                        listen_state->initial_window_size;
                    channel->local.window_size =
                        listen_state->initial_window_size;
                    channel->local.packet_size = listen_state->packet_size;

                    _libssh2_debug(session, LIBSSH2_TRACE_CONN,
                                   "Connection queued: channel %lu/%lu "
                                   "win %lu/%lu packet %lu/%lu",
                                   channel->local.id, channel->remote.id,
                                   channel->local.window_size,
                                   channel->remote.window_size,
                                   channel->local.packet_size,
                                   channel->remote.packet_size);

                    p = listen_state->packet;
                    *(p++) = SSH_MSG_CHANNEL_OPEN_CONFIRMATION;
                    _libssh2_store_u32(&p, channel->remote.id);
                    _libssh2_store_u32(&p, channel->local.id);
                    _libssh2_store_u32(&p,
                                       channel->remote.window_size_initial);
                    _libssh2_store_u32(&p, channel->remote.packet_size);

                    listen_state->state = libssh2_NB_state_created;
                }

                if (listen_state->state == libssh2_NB_state_created) {
                    rc = _libssh2_transport_send(session, listen_state->packet,
                                                 17, NULL, 0);
                    if (rc == LIBSSH2_ERROR_EAGAIN)
                        return rc;
                    else if (rc) {
                        listen_state->state = libssh2_NB_state_idle;
                        return _libssh2_error(session, rc,
                                              "Unable to send channel "
                                              "open confirmation");
                    }

                    /* Link the channel into the end of the queue list */
                    if (listen_state->channel) {
                        _libssh2_list_add(&listn->queue,
                                          &listen_state->channel->node);
                        listn->queue_size++;
                    }

                    listen_state->state = libssh2_NB_state_idle;
                    return 0;
                }
            }

            listn = _libssh2_list_next(&listn->node);
        }

        listen_state->state = libssh2_NB_state_sent;
    }

    /* We're not listening to you */
    p = listen_state->packet;
    *(p++) = SSH_MSG_CHANNEL_OPEN_FAILURE;
    _libssh2_store_u32(&p, listen_state->sender_channel);
    _libssh2_store_u32(&p, failure_code);
    _libssh2_store_str(&p, FwdNotReq, sizeof(FwdNotReq) - 1);
    _libssh2_htonu32(p, 0);

    rc = _libssh2_transport_send(session, listen_state->packet,
                                 packet_len, NULL, 0);
    if (rc == LIBSSH2_ERROR_EAGAIN) {
        return rc;
    } else if (rc) {
        listen_state->state = libssh2_NB_state_idle;
        return _libssh2_error(session, rc, "Unable to send open failure");

    }
    listen_state->state = libssh2_NB_state_idle;
    return 0;
}